

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::val::ValidationState_t::GetDimension(ValidationState_t *this,uint32_t id)

{
  Op OVar1;
  uint32_t uVar2;
  Instruction *this_00;
  Instruction *inst;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  this_00 = FindDef(this,id);
  if (this_00 == (Instruction *)0x0) {
    __assert_fail("inst",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x382,"uint32_t spvtools::val::ValidationState_t::GetDimension(uint32_t) const");
  }
  OVar1 = Instruction::opcode(this_00);
  if (OVar1 - OpTypeBool < 3) {
    this_local._4_4_ = 1;
  }
  else if (OVar1 - OpTypeVector < 2) {
    this_local._4_4_ = Instruction::word(this_00,3);
  }
  else if ((OVar1 == OpTypeCooperativeMatrixKHR) || (OVar1 == OpTypeCooperativeMatrixNV)) {
    this_local._4_4_ = 0;
  }
  else {
    uVar2 = Instruction::type_id(this_00);
    if (uVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x399,"uint32_t spvtools::val::ValidationState_t::GetDimension(uint32_t) const"
                   );
    }
    uVar2 = Instruction::type_id(this_00);
    this_local._4_4_ = GetDimension(this,uVar2);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t ValidationState_t::GetDimension(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  assert(inst);

  switch (inst->opcode()) {
    case spv::Op::OpTypeFloat:
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeBool:
      return 1;

    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
      return inst->word(3);

    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      // Actual dimension isn't known, return 0
      return 0;

    default:
      break;
  }

  if (inst->type_id()) return GetDimension(inst->type_id());

  assert(0);
  return 0;
}